

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  size_type *psVar1;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *text;
  ParsedHashMap *this_00;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var3;
  element_type *peVar4;
  _Hash_node_base *p_Var5;
  key_type *__k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  ParseResult *pPVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  char cVar10;
  int iVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  pointer pcVar15;
  _Hash_node_base *p_Var16;
  char *pcVar17;
  _Alloc_hider this_02;
  undefined8 uVar18;
  pointer __k_00;
  long *plVar19;
  shared_ptr<cxxopts::OptionDetails> *psVar20;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_158;
  ParseResult *local_140;
  ParseResult *parsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  size_t local_118;
  size_t hash;
  undefined1 auStack_108 [8];
  ArguDesc argu_desc;
  element_type *local_b0;
  size_t hash_2;
  undefined1 local_a0 [8];
  shared_ptr<cxxopts::OptionDetails> value;
  string name;
  string arg_value;
  bool local_35;
  int local_34;
  bool matched;
  int current;
  
  local_34 = 1;
  __k_00 = (this->m_positional->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  parsed = (ParseResult *)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argu_desc.value.field_2._12_4_ = (undefined4)CONCAT71((int7)((ulong)this->m_positional >> 8),1);
  local_140 = __return_storage_ptr__;
  arg_value.field_2._8_8_ = this;
  if (argc != 1) {
    this_00 = &this->m_parsed;
    hash = (size_t)&this->m_sequential;
    text = &value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    do {
      pcVar17 = argv[local_34];
      if (((*pcVar17 == '-') && (pcVar17[1] == '-')) && (pcVar17[2] == '\0')) {
        local_34 = local_34 + 1;
        argu_desc.value.field_2._12_4_ = 0;
        break;
      }
      local_35 = false;
      values::parser_tool::ParseArgument((ArguDesc *)auStack_108,pcVar17,&local_35);
      if (local_35 == false) {
        pcVar17 = argv[local_34];
        if (((*pcVar17 == '-') && (pcVar17[1] != '\0')) && (this->m_allow_unrecognised == false)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)text,pcVar17,(allocator<char> *)(name.field_2._M_local_buf + 8));
          throw_or_mimic<cxxopts::option_syntax_exception>((string *)text);
          if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length) {
            operator_delete(value.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,name._M_string_length + 1);
          }
          pcVar17 = argv[local_34];
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,pcVar17,(allocator<char> *)&stack0xffffffffffffff50);
        while (__k_00 != (this->m_positional->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
          cVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this->m_options->_M_h,__k_00);
          if (cVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
          }
          else {
            cVar10 = (**(code **)(**(long **)(*(long *)((long)cVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                                  ._M_cur + 0x28) + 0x60) + 0x30))();
            psVar20 = (shared_ptr<cxxopts::OptionDetails> *)
                      ((long)cVar12.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x28);
            if (cVar10 != '\0') {
              bVar7 = true;
              parse_option(this,psVar20,__k_00,(string *)text);
              goto LAB_001164b0;
            }
            name.field_2._8_8_ =
                 ((psVar20->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->m_hash;
            pmVar13 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,(key_type *)(name.field_2._M_local_buf + 8));
            if (pmVar13->m_count == 0) {
              parse_option(this,psVar20,__k_00,(string *)text);
              __k_00 = __k_00 + 1;
              bVar7 = true;
              goto LAB_001164b0;
            }
            __k_00 = __k_00 + 1;
          }
        }
        bVar7 = false;
LAB_001164b0:
        if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length) {
          operator_delete(value.
                          super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,name._M_string_length + 1);
        }
        if (!bVar7) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parsed,
                     argv + local_34);
        }
      }
      else if (argu_desc.arg_name.field_2._M_local_buf[8] == '\x01') {
        if (argu_desc.arg_name._M_dataplus._M_p != (pointer)0x0) {
          pcVar15 = (pointer)0x0;
          do {
            value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length;
            std::__cxx11::string::_M_construct((ulong)text,'\x01');
            cVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this->m_options->_M_h,(key_type *)text);
            if (cVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              iVar11 = 6;
              if (this->m_allow_unrecognised == false) {
                throw_or_mimic<cxxopts::option_not_exists_exception>((string *)text);
                this = (OptionParser *)arg_value.field_2._8_8_;
                goto LAB_0011608b;
              }
            }
            else {
LAB_0011608b:
              local_a0 = *(undefined1 (*) [8])
                          ((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                 ._M_cur + 0x28);
              value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)
                    ((long)cVar12.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                           ._M_cur + 0x30);
              if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  psVar1 = &((value.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_short)._M_string_length;
                  *(int *)psVar1 = (int)*psVar1 + 1;
                  UNLOCK();
                }
                else {
                  psVar1 = &((value.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_short)._M_string_length;
                  *(int *)psVar1 = (int)*psVar1 + 1;
                }
              }
              if (pcVar15 + 1 == argu_desc.arg_name._M_dataplus._M_p) {
                checked_parse_arg(this,argc,argv,&local_34,
                                  (shared_ptr<cxxopts::OptionDetails> *)local_a0,(string *)text);
LAB_00116283:
                iVar11 = 0;
              }
              else {
                iVar11 = (*((((element_type *)local_a0)->m_value).
                            super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_vptr_Value[7])();
                if ((char)iVar11 != '\0') {
                  (*((((shared_ptr<const_cxxopts::Value> *)((long)local_a0 + 0x60))->
                     super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    _vptr_Value[9])((undefined1 *)((long)&name.field_2 + 8));
                  local_118 = *(size_t *)((long)local_a0 + 0x78);
                  pmVar13 = std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)this_00,&local_118);
                  local_b0 = (element_type *)local_a0;
                  hash_2 = (size_t)value.
                                   super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                  if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr != (element_type *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      psVar1 = &((value.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_short)._M_string_length;
                      *(int *)psVar1 = (int)*psVar1 + 1;
                      UNLOCK();
                    }
                    else {
                      psVar1 = &((value.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_short)._M_string_length;
                      *(int *)psVar1 = (int)*psVar1 + 1;
                    }
                  }
                  OptionValue::ensure_value
                            (pmVar13,(shared_ptr<const_cxxopts::OptionDetails> *)
                                     &stack0xffffffffffffff50);
                  pmVar13->m_count = pmVar13->m_count + 1;
                  peVar4 = (pmVar13->m_value).
                           super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  (*peVar4->_vptr_Value[3])(peVar4,(undefined1 *)((long)&name.field_2 + 8));
                  pmVar13->m_long_name = &local_b0->m_long;
                  if (hash_2 != 0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hash_2);
                  }
                  std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                            ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)hash,
                             (string *)((long)local_a0 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&name.field_2 + 8));
                  if ((size_type *)name.field_2._8_8_ != &arg_value._M_string_length) {
                    operator_delete((void *)name.field_2._8_8_,arg_value._M_string_length + 1);
                  }
                  goto LAB_00116283;
                }
                if (argu_desc.arg_name._M_dataplus._M_p <= pcVar15 + 1) {
                  throw_or_mimic<cxxopts::option_requires_argument_exception>((string *)text);
                  goto LAB_00116283;
                }
                std::__cxx11::string::substr((ulong)((long)&name.field_2 + 8),(ulong)auStack_108);
                local_118 = *(size_t *)((long)local_a0 + 0x78);
                pmVar13 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)this_00,&local_118);
                local_b0 = (element_type *)local_a0;
                hash_2 = (size_t)value.
                                 super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    psVar1 = &((value.
                                super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_short)._M_string_length;
                    *(int *)psVar1 = (int)*psVar1 + 1;
                    UNLOCK();
                  }
                  else {
                    psVar1 = &((value.
                                super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_short)._M_string_length;
                    *(int *)psVar1 = (int)*psVar1 + 1;
                  }
                }
                OptionValue::ensure_value
                          (pmVar13,(shared_ptr<const_cxxopts::OptionDetails> *)
                                   &stack0xffffffffffffff50);
                pmVar13->m_count = pmVar13->m_count + 1;
                peVar4 = (pmVar13->m_value).
                         super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                (*peVar4->_vptr_Value[3])(peVar4,(undefined1 *)((long)&name.field_2 + 8));
                pmVar13->m_long_name = &local_b0->m_long;
                if (hash_2 != 0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hash_2);
                }
                std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                          ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)hash,
                           (string *)((long)local_a0 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&name.field_2 + 8));
                if ((size_type *)name.field_2._8_8_ != &arg_value._M_string_length) {
                  operator_delete((void *)name.field_2._8_8_,arg_value._M_string_length + 1);
                }
                iVar11 = 4;
              }
              if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           value.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
            }
            if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length) {
              operator_delete(value.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi,name._M_string_length + 1);
            }
            this = (OptionParser *)arg_value.field_2._8_8_;
          } while (((iVar11 == 6) || (iVar11 == 0)) &&
                  (pcVar15 = pcVar15 + 1, pcVar15 != argu_desc.arg_name._M_dataplus._M_p));
        }
      }
      else if (argu_desc.arg_name._M_dataplus._M_p != (pointer)0x0) {
        cVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this->m_options->_M_h,(key_type *)auStack_108);
        if (cVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (this->m_allow_unrecognised == true) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parsed,
                       argv + local_34);
            goto LAB_00116618;
          }
          throw_or_mimic<cxxopts::option_not_exists_exception>((string *)auStack_108);
        }
        name.field_2._8_8_ =
             *(long *)((long)cVar12.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x28);
        arg_value._M_dataplus._M_p =
             *(pointer *)
              ((long)cVar12.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                     ._M_cur + 0x30);
        if (arg_value._M_dataplus._M_p != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(arg_value._M_dataplus._M_p + 8) = *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(arg_value._M_dataplus._M_p + 8) = *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
          }
        }
        if (argu_desc.arg_name.field_2._M_local_buf[9] == '\x01') {
          local_b0 = *(element_type **)(name.field_2._8_8_ + 0x78);
          pmVar13 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,(key_type *)&stack0xffffffffffffff50);
          value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name.field_2._8_8_;
          name._M_dataplus = arg_value._M_dataplus;
          if (arg_value._M_dataplus._M_p != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(arg_value._M_dataplus._M_p + 8) =
                   *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(arg_value._M_dataplus._M_p + 8) =
                   *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
            }
          }
          OptionValue::ensure_value(pmVar13,(shared_ptr<const_cxxopts::OptionDetails> *)text);
          pmVar13->m_count = pmVar13->m_count + 1;
          peVar4 = (pmVar13->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar4->_vptr_Value[3])(peVar4,&argu_desc.grouping);
          pmVar13->m_long_name =
               (string *)
               (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 2);
          if (name._M_dataplus._M_p != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_dataplus._M_p);
          }
          std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)hash,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (name.field_2._8_8_ + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &argu_desc.grouping);
        }
        else {
          checked_parse_arg(this,argc,argv,&local_34,
                            (shared_ptr<cxxopts::OptionDetails> *)((long)&name.field_2 + 8),
                            (string *)auStack_108);
        }
        if (arg_value._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg_value._M_dataplus._M_p);
        }
      }
LAB_00116618:
      local_34 = local_34 + 1;
      if ((size_type *)argu_desc._32_8_ != &argu_desc.value._M_string_length) {
        operator_delete((void *)argu_desc._32_8_,argu_desc.value._M_string_length + 1);
      }
      if (auStack_108 != (undefined1  [8])&argu_desc.arg_name._M_string_length) {
        operator_delete((void *)auStack_108,argu_desc.arg_name._M_string_length + 1);
      }
    } while (local_34 != argc);
  }
  p_Var16 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    p_Var2 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)(arg_value.field_2._8_8_ + 0x30);
    do {
      p_Var5 = p_Var16[5]._M_nxt[0xc]._M_nxt;
      auStack_108 = (undefined1  [8])p_Var16[5]._M_nxt[0xf]._M_nxt;
      pmVar13 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](p_Var2,(key_type *)auStack_108);
      cVar10 = (*(code *)p_Var5->_M_nxt[5]._M_nxt)(p_Var5);
      if (cVar10 == '\0') {
        auStack_108 = (undefined1  [8])p_Var16[5]._M_nxt[0xf]._M_nxt;
        pmVar13 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](p_Var2,(key_type *)auStack_108);
        p_Var5 = p_Var16[5]._M_nxt;
        this_02._M_p = (pointer)p_Var16[6]._M_nxt;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pmVar13->m_long_name = (string *)(p_Var5 + 4);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p)->_M_use_count + 1;
          }
          pmVar13->m_long_name = (string *)(p_Var5 + 4);
LAB_0011677c:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_p);
        }
      }
      else if ((pmVar13->m_count == 0) && (pmVar13->m_default == false)) {
        auStack_108 = (undefined1  [8])p_Var16[5]._M_nxt[0xf]._M_nxt;
        pmVar13 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](p_Var2,(key_type *)auStack_108);
        auStack_108 = (undefined1  [8])p_Var16[5]._M_nxt;
        argu_desc.arg_name._M_dataplus._M_p = (pointer)p_Var16[6]._M_nxt;
        if ((_Hash_node_base *)argu_desc.arg_name._M_dataplus._M_p != (_Hash_node_base *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->_M_nxt =
                 *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->
                          _M_nxt + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->_M_nxt =
                 *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->
                          _M_nxt + 1;
          }
        }
        OptionValue::ensure_value(pmVar13,(shared_ptr<const_cxxopts::OptionDetails> *)auStack_108);
        pmVar13->m_default = true;
        pmVar13->m_long_name = (string *)((long)auStack_108 + 0x20);
        (*((pmVar13->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_Value[4])();
        this_02 = argu_desc.arg_name._M_dataplus;
        if (argu_desc.arg_name._M_dataplus._M_p != (pointer)0x0) goto LAB_0011677c;
      }
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  uVar18 = arg_value.field_2._8_8_;
  if (argu_desc.value.field_2._M_local_buf[0xc] == '\0') {
    if (local_34 < argc) {
      p_Var2 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)(arg_value.field_2._8_8_ + 0x30);
      do {
        uVar18 = arg_value.field_2._8_8_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_108,argv[local_34],
                   (allocator<char> *)(name.field_2._M_local_buf + 8));
        while (__k_00 != *(string **)(*(long *)(uVar18 + 8) + 8)) {
          cVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(*(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            **)uVar18,__k_00);
          if (cVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
          }
          else {
            cVar10 = (**(code **)(**(long **)(*(long *)((long)cVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                                  ._M_cur + 0x28) + 0x60) + 0x30))();
            psVar20 = (shared_ptr<cxxopts::OptionDetails> *)
                      ((long)cVar12.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x28);
            if (cVar10 != '\0') {
              bVar7 = true;
              parse_option((OptionParser *)uVar18,psVar20,__k_00,(string *)auStack_108);
              goto LAB_001168ab;
            }
            value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((psVar20->
                      super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->m_hash;
            pmVar13 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](p_Var2,(key_type *)
                                          &value.
                                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
            if (pmVar13->m_count == 0) {
              parse_option((OptionParser *)uVar18,psVar20,__k_00,(string *)auStack_108);
              __k_00 = __k_00 + 1;
              bVar7 = true;
              goto LAB_001168ab;
            }
            __k_00 = __k_00 + 1;
          }
        }
        bVar7 = false;
LAB_001168ab:
        if (auStack_108 != (undefined1  [8])&argu_desc.arg_name._M_string_length) {
          operator_delete((void *)auStack_108,argu_desc.arg_name._M_string_length + 1);
        }
      } while ((bVar7) && (local_34 = local_34 + 1, local_34 < argc));
    }
    uVar18 = arg_value.field_2._8_8_;
    if (local_34 != argc) {
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parsed,
                   argv + local_34);
        local_34 = local_34 + 1;
      } while (local_34 != argc);
    }
  }
  plVar19 = *(long **)(*(long *)uVar18 + 0x10);
  if (plVar19 != (long *)0x0) {
    this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)(uVar18 + 0x68);
    p_Var3 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(uVar18 + 0x30);
    do {
      __k = (key_type *)plVar19[5];
      p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__k[3].field_2 + 8);
      value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var6;
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](this_01,__k);
      _Var9._M_pi = value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      *pmVar14 = (mapped_type)p_Var6;
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](this_01,__k + 1);
      *pmVar14 = (mapped_type)_Var9._M_pi;
      argu_desc.arg_name._M_string_length = 0;
      argu_desc.arg_name.field_2._M_allocated_capacity = 0;
      auStack_108 = (undefined1  [8])0x0;
      argu_desc.arg_name._M_dataplus._M_p = (pointer)0x0;
      argu_desc.arg_name.field_2._8_8_ = 0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long&,cxxopts::OptionValue>
                (p_Var3,&value.
                         super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,auStack_108);
      uVar18 = arg_value.field_2._8_8_;
      if (argu_desc.arg_name._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   argu_desc.arg_name._M_string_length);
      }
      plVar19 = (long *)*plVar19;
    } while (plVar19 != (long *)0x0);
  }
  pPVar8 = local_140;
  local_158.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(uVar18 + 0x10);
  local_158.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)(uVar18 + 0x18);
  local_158.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(uVar18 + 0x20);
  *(long *)(uVar18 + 0x10) = 0;
  *(long *)(uVar18 + 0x18) = 0;
  *(long *)(uVar18 + 0x20) = 0;
  ParseResult::ParseResult
            (local_140,(NameHashMap *)(uVar18 + 0x68),(ParsedHashMap *)(uVar18 + 0x30),&local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsed);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsed);
  return pPVar8;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  auto next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }
    bool matched = false;
    values::parser_tool::ArguDesc argu_desc =
        values::parser_tool::ParseArgument(argv[current], matched);

    if (!matched)
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.emplace_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (argu_desc.grouping)
      {
        const std::string& s = argu_desc.arg_name;

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else if (i + 1 < s.size())
          {
            std::string arg_value = s.substr(i + 1);
            parse_option(value, name, arg_value);
            break;
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (argu_desc.arg_name.length() != 0)
      {
        const std::string& name = argu_desc.arg_name;

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.emplace_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (argu_desc.set_value)
        {
          //parse the option given

          parse_option(opt, name, argu_desc.value);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if (value.has_default()) {
      if (!store.count() && !store.has_default()) {
        parse_default(detail);
      }
    }
    else {
      parse_no_value(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.emplace_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}